

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model_parameters.cc
# Opt level: O0

void __thiscall xLearn::Model::Shrink(Model *this)

{
  long in_RDI;
  
  if (*(long *)(in_RDI + 0x70) != 0) {
    memcpy(*(void **)(in_RDI + 0x58),*(void **)(in_RDI + 0x70),(ulong)*(uint *)(in_RDI + 0x40) << 2)
    ;
  }
  if (*(long *)(in_RDI + 0x78) != 0) {
    memcpy(*(void **)(in_RDI + 0x60),*(void **)(in_RDI + 0x78),(ulong)*(uint *)(in_RDI + 0x44) << 2)
    ;
  }
  if (*(long *)(in_RDI + 0x80) != 0) {
    memcpy(*(void **)(in_RDI + 0x68),*(void **)(in_RDI + 0x80),(ulong)*(uint *)(in_RDI + 0x54) << 2)
    ;
  }
  return;
}

Assistant:

void Model::Shrink() {
  // Copy best model parameters
  if (param_best_w_ != nullptr) {
    memcpy(param_w_, param_best_w_, param_num_w_*sizeof(real_t));
  }
  if (param_best_v_ != nullptr) {
    memcpy(param_v_, param_best_v_, param_num_v_*sizeof(real_t));
  }
  if (param_best_b_ != nullptr) {
    memcpy(param_b_, param_best_b_, aux_size_*sizeof(real_t));
  }
}